

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CmakeRegenTest.cpp
# Opt level: O3

void __thiscall
TestRegenerateCmakeAddSubdirectory_NoSubDirs::Run
          (TestRegenerateCmakeAddSubdirectory_NoSubDirs *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  runtime_error *this_00;
  bool bVar4;
  string expectedOutput;
  TemporaryWorkingDirectory workdir;
  ostringstream oss;
  Component comp;
  undefined1 *local_458;
  size_t local_450;
  undefined1 local_448 [16];
  undefined1 *local_438;
  size_t local_430;
  undefined1 local_428 [16];
  TemporaryWorkingDirectory local_418;
  undefined1 local_3d8 [376];
  Component local_260;
  
  TemporaryWorkingDirectory::TemporaryWorkingDirectory(&local_418,(this->super_Test).name);
  pcVar1 = local_3d8 + 0x10;
  local_3d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"MyComponent","");
  paVar2 = &local_260.root.m_pathname.field_2;
  local_260.root.m_pathname._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,local_418.workDir.m_pathname._M_dataplus._M_p,
             local_418.workDir.m_pathname._M_dataplus._M_p +
             local_418.workDir.m_pathname._M_string_length);
  boost::filesystem::path::operator/=(&local_260.root,(path *)local_3d8);
  boost::filesystem::detail::create_directories(&local_260.root,(error_code *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260.root.m_pathname._M_dataplus._M_p != paVar2) {
    operator_delete(local_260.root.m_pathname._M_dataplus._M_p);
  }
  if ((pointer)local_3d8._0_8_ != pcVar1) {
    operator_delete((void *)local_3d8._0_8_);
  }
  local_3d8._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3d8,"./MyComponent/","");
  Component::Component(&local_260,(path *)local_3d8);
  if ((pointer)local_3d8._0_8_ != pcVar1) {
    operator_delete((void *)local_3d8._0_8_);
  }
  local_458 = local_448;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_458,"");
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_3d8);
  RegenerateCmakeAddSubdirectory((ostream *)local_3d8,&local_260);
  std::__cxx11::stringbuf::str();
  if (local_430 == local_450) {
    if (local_430 == 0) {
      bVar4 = true;
    }
    else {
      iVar3 = bcmp(local_438,local_458,local_430);
      bVar4 = iVar3 == 0;
    }
  }
  else {
    bVar4 = false;
  }
  if (local_438 != local_428) {
    operator_delete(local_438);
  }
  if (bVar4) {
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_3d8);
    std::ios_base::~ios_base((ios_base *)(local_3d8 + 0x70));
    if (local_458 != local_448) {
      operator_delete(local_458);
    }
    Component::~Component(&local_260);
    TemporaryWorkingDirectory::~TemporaryWorkingDirectory(&local_418);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Assertion failed: oss.str() == expectedOutput");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

TEST(RegenerateCmakeAddSubdirectory_NoSubDirs) {
  TemporaryWorkingDirectory workdir(name);
  filesystem::create_directories(workdir() / "MyComponent");

  Component comp("./MyComponent/");

  const std::string expectedOutput("");

  std::ostringstream oss;
  RegenerateCmakeAddSubdirectory(oss, comp);

  ASSERT(oss.str() == expectedOutput);
}